

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsics.h
# Opt level: O2

void intgemm::SSE2::Kernels16::Quantize(float *input,int16_t *output,float quant_mult,Index size)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  for (lVar1 = (ulong)size << 2; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    auVar2._0_4_ = (int)(*input * quant_mult);
    auVar2._4_4_ = (int)(input[1] * quant_mult);
    auVar2._8_4_ = (int)(input[2] * quant_mult);
    auVar2._12_4_ = (int)(input[3] * quant_mult);
    auVar3._4_4_ = (int)(input[5] * quant_mult);
    auVar3._0_4_ = (int)(input[4] * quant_mult);
    auVar3._8_4_ = (int)(input[6] * quant_mult);
    auVar3._12_4_ = (int)(input[7] * quant_mult);
    auVar3 = packssdw(auVar2,auVar3);
    *(undefined1 (*) [16])output = auVar3;
    input = input + 8;
    output = (int16_t *)((long)output + 0x10);
  }
  return;
}

Assistant:

INTGEMM_SSE2 inline __m128 set1_ps<__m128>(float to) {
  return _mm_set1_ps(to);
}